

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

void Abc_BufCollectTfiCone_rec(Abc_Obj_t *pNode,Vec_Int_t *vNodes)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  int in_EDX;
  int Fill;
  long lVar6;
  
  pAVar3 = pNode->pNtk;
  iVar1 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pNode->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar1] = iVar2;
    uVar5 = *(uint *)&pNode->field_0x14 & 0xf;
    if ((uVar5 != 2) && (uVar5 != 5)) {
      if (uVar5 == 7) {
        if (0 < (pNode->vFanins).nSize) {
          lVar6 = 0;
          do {
            Abc_BufCollectTfiCone_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar6]],
                       vNodes);
            lVar6 = lVar6 + 1;
          } while (lVar6 < (pNode->vFanins).nSize);
        }
        Vec_IntPush(vNodes,pNode->Id);
        return;
      }
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclBuffer.c"
                    ,0x27b,"void Abc_BufCollectTfiCone_rec(Abc_Obj_t *, Vec_Int_t *)");
    }
  }
  return;
}

Assistant:

void Abc_BufCollectTfiCone_rec( Abc_Obj_t * pNode, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pNext;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    if ( Abc_ObjIsCi(pNode) )
        return;
    assert( Abc_ObjIsNode(pNode) );
    Abc_ObjForEachFanin( pNode, pNext, i )
        Abc_BufCollectTfiCone_rec( pNext, vNodes );
    Vec_IntPush( vNodes, Abc_ObjId(pNode) );
}